

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestDouble_IsInfinite(void)

{
  bool in_CL;
  
  CheckHelper((char *)0xc2,0xc1c87b,(char *)0x1,in_CL);
  CheckHelper((char *)0xc3,0xc1c8a3,(char *)0x1,in_CL);
  CheckHelper((char *)0xc4,0xc1c8cc,(char *)0x1,in_CL);
  CheckHelper((char *)0xc5,0xc1c8f0,(char *)0x1,in_CL);
  CheckHelper((char *)0xc6,0xc1c90a,(char *)0x1,in_CL);
  CheckHelper((char *)0xc7,0xc1c925,(char *)0x1,in_CL);
  CheckHelper((char *)0xc8,0xc1c93f,(char *)0x1,in_CL);
  CheckHelper((char *)0xca,0xc1c95a,(char *)0x1,in_CL);
  return;
}

Assistant:

TEST(Double_IsInfinite) {
  CHECK(Double(Double::Infinity()).IsInfinite());
  CHECK(Double(-Double::Infinity()).IsInfinite());
  CHECK(!Double(Double::NaN()).IsInfinite());
  CHECK(!Double(0.0).IsInfinite());
  CHECK(!Double(-0.0).IsInfinite());
  CHECK(!Double(1.0).IsInfinite());
  CHECK(!Double(-1.0).IsInfinite());
  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK(!Double(min_double64).IsInfinite());
}